

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

void testing::internal::
     GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<BitDepthParams<unsigned_char,8,false>,BitDepthParams<unsigned_short,8,true>,BitDepthParams<unsigned_short,10,true>,BitDepthParams<unsigned_short,12,true>>>
               (value_type *param_1,int param_2)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  int local_14;
  value_type *local_10;
  
  this = &local_38;
  local_14 = param_2;
  local_10 = param_1;
  DefaultNameGenerator::GetName<BitDepthParams<unsigned_char,8,false>>
            ((int)((ulong)param_1 >> 0x20));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this,param_1);
  std::__cxx11::string::~string((string *)&local_38);
  GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<BitDepthParams<unsigned_short,8,true>,BitDepthParams<unsigned_short,10,true>,BitDepthParams<unsigned_short,12,true>>>
            (local_10,local_14 + 1);
  return;
}

Assistant:

void GenerateNamesRecursively(Types, std::vector<std::string>* result, int i) {
  result->push_back(NameGenerator::template GetName<typename Types::Head>(i));
  GenerateNamesRecursively<NameGenerator>(typename Types::Tail(), result,
                                          i + 1);
}